

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t driver::zeKernelSetCacheConfig(ze_kernel_handle_t hKernel,ze_cache_config_flags_t flags)

{
  ze_result_t zVar1;
  
  if (DAT_0010d660 != (code *)0x0) {
    zVar1 = (*DAT_0010d660)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetCacheConfig(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_cache_config_flags_t flags                   ///< [in] cache configuration.
                                                        ///< must be 0 (default configuration) or a valid combination of ::ze_cache_config_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetCacheConfig = context.zeDdiTable.Kernel.pfnSetCacheConfig;
        if( nullptr != pfnSetCacheConfig )
        {
            result = pfnSetCacheConfig( hKernel, flags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }